

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O3

void __thiscall
slang::ast::ValueDriver::ValueDriver
          (ValueDriver *this,DriverKind kind,Expression *longestStaticPrefix,
          Symbol *containingSymbol,bitmask<slang::ast::AssignFlags> flags)

{
  DriverSource DVar1;
  
  (this->prefixExpression).ptr = longestStaticPrefix;
  (this->containingSymbol).ptr = containingSymbol;
  this->procCallExpression = (Expression *)0x0;
  (this->flags).m_bits = flags.m_bits;
  this->kind = kind;
  this->isFromSideEffect = false;
  if (containingSymbol->kind == Subroutine) {
    DVar1 = Subroutine;
  }
  else if (containingSymbol->kind == ProceduralBlock) {
    DVar1 = (DriverSource)containingSymbol[1].kind;
  }
  else {
    DVar1 = Other;
  }
  this->source = DVar1;
  return;
}

Assistant:

constexpr not_null(U&& u) : ptr(std::forward<U>(u)) {
        SLANG_ASSERT(ptr);
    }